

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_group.h
# Opt level: O1

void __thiscall features::deep_copy_from(features *this,features *src)

{
  float *_begin;
  unsigned_long *_begin_00;
  
  v_array<float>::clear(&this->values);
  _begin = (src->values)._begin;
  push_many<float>(&this->values,_begin,(long)(src->values)._end - (long)_begin >> 2);
  v_array<unsigned_long>::clear(&this->indicies);
  _begin_00 = (src->indicies)._begin;
  push_many<unsigned_long>
            (&this->indicies,_begin_00,(long)(src->indicies)._end - (long)_begin_00 >> 3);
  copy_array_no_memcpy<std::shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>>>
            (&this->space_names,&src->space_names);
  this->sum_feat_sq = src->sum_feat_sq;
  return;
}

Assistant:

void deep_copy_from(const features& src)
  {
    copy_array(values, src.values);
    copy_array(indicies, src.indicies);
    copy_array_no_memcpy(space_names, src.space_names);
    sum_feat_sq = src.sum_feat_sq;
  }